

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O3

UINT32 NES_APU_np_Render(void *chip,INT32 *b)

{
  INT32 IVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  UINT32 clocks;
  ulong uVar6;
  int iVar7;
  
  uVar6 = *(long *)((long)chip + 0x170) + *(long *)((long)chip + 0x168);
  *(ulong *)((long)chip + 0x170) = uVar6 & 0xffffffff;
  clocks = (UINT32)(uVar6 >> 0x20);
  IVar1 = calc_sqr((NES_APU *)chip,0,clocks);
  *(INT32 *)((long)chip + 0x54) = IVar1;
  IVar1 = calc_sqr((NES_APU *)chip,1,clocks);
  iVar2 = 0;
  if ((*(uint *)((long)chip + 0x1c) & 1) == 0) {
    iVar2 = *(int *)((long)chip + 0x54);
  }
  iVar7 = 0;
  if ((*(uint *)((long)chip + 0x1c) & 2) == 0) {
    iVar7 = IVar1;
  }
  *(int *)((long)chip + 0x54) = iVar2;
  *(int *)((long)chip + 0x58) = iVar7;
  if (*(int *)((long)chip + 0xc) == 0) {
    iVar4 = (iVar2 * *(int *)((long)chip + 0xe4)) / 0xf;
    iVar3 = (iVar7 * *(int *)((long)chip + 0xe4)) / 0xf;
  }
  else {
    iVar4 = *(int *)((long)chip + (long)(iVar2 + iVar7) * 4 + 100);
    iVar2 = iVar2 * 0x40;
    iVar7 = iVar7 * 0x40;
    iVar5 = iVar2 + iVar7;
    iVar3 = iVar4;
    if (iVar5 != 0 && SCARRY4(iVar2,iVar7) == iVar5 < 0) {
      iVar7 = iVar7 * iVar4;
      iVar4 = (iVar2 * iVar4) / iVar5;
      iVar3 = iVar7 / iVar5;
    }
  }
  iVar2 = *(int *)((long)chip + 0x20) * iVar4;
  *b = iVar2;
  *b = *(int *)((long)chip + 0x24) * iVar3 + iVar2 >> 5;
  iVar4 = iVar4 * *(int *)((long)chip + 0x28);
  b[1] = iVar4;
  b[1] = iVar3 * *(int *)((long)chip + 0x2c) + iVar4 >> 5;
  return 2;
}

Assistant:

UINT32 NES_APU_np_Render(void* chip, INT32 b[2])
{
	NES_APU* apu = (NES_APU*)chip;
	UINT32 clocks;
	INT32 m[2];

	RC_STEP(&apu->tick_count);
	clocks = RC_GET_VAL(&apu->tick_count);
	RC_MASK(&apu->tick_count);
	Tick(apu, clocks);

	apu->out[0] = (apu->mask & 1) ? 0 : apu->out[0];
	apu->out[1] = (apu->mask & 2) ? 0 : apu->out[1];

	if(apu->option[OPT_NONLINEAR_MIXER])
	{
		INT32 ref;
		INT32 voltage = apu->square_table[apu->out[0] + apu->out[1]];
		m[0] = apu->out[0] << 6;
		m[1] = apu->out[1] << 6;
		ref = m[0] + m[1];
		if (ref > 0)
		{
			m[0] = (m[0] * voltage) / ref;
			m[1] = (m[1] * voltage) / ref;
		}
		else
		{
			m[0] = voltage;
			m[1] = voltage;
		}
	}
	else
	{
		m[0] = (apu->out[0] * apu->square_linear) / 15;
		m[1] = (apu->out[1] * apu->square_linear) / 15;
	}

	// Shifting is (x-2) to match the volume of MAME's NES APU sound core
	b[0]  = m[0] * apu->sm[0][0];
	b[0] += m[1] * apu->sm[0][1];
	b[0] >>= 7-2;	// was 7, but is now 8 for bipolar square

	b[1]  = m[0] * apu->sm[1][0];
	b[1] += m[1] * apu->sm[1][1];
	b[1] >>= 7-2;	// see above

	return 2;
}